

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

StorageView<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> * __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
::MakeStorageView(StorageView<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                  *__return_storage_ptr__,
                 Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                 *this)

{
  bool bVar1;
  Pointer<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> ppCVar2;
  SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> SVar3;
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  bVar1 = GetIsAllocated(this);
  if (bVar1) {
    ppCVar2 = GetAllocatedData(this);
    __return_storage_ptr__->data = ppCVar2;
    SVar3 = GetSize(this);
    __return_storage_ptr__->size = SVar3;
    SVar3 = GetAllocatedCapacity(this);
    __return_storage_ptr__->capacity = SVar3;
  }
  else {
    ppCVar2 = GetInlinedData(this);
    __return_storage_ptr__->data = ppCVar2;
    SVar3 = GetSize(this);
    __return_storage_ptr__->size = SVar3;
    SVar3 = GetInlinedCapacity(this);
    __return_storage_ptr__->capacity = SVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

StorageView<A> MakeStorageView() {
    return GetIsAllocated() ? StorageView<A>{GetAllocatedData(), GetSize(),
                                             GetAllocatedCapacity()}
                            : StorageView<A>{GetInlinedData(), GetSize(),
                                             GetInlinedCapacity()};
  }